

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

void __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<-15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<-28>,_boost::random::detail::no_tempering>
::seed(well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<_15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<_28>,_boost::random::detail::no_tempering>
       *this,uint *value)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = *value;
  this->state_[0] = uVar2;
  for (lVar1 = 1; lVar1 != 0x19; lVar1 = lVar1 + 1) {
    uVar2 = (uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + (int)lVar1;
    this->state_[lVar1] = uVar2;
  }
  this->index_ = 0x19;
  return;
}

Assistant:

BOOST_RANDOM_DETAIL_ARITHMETIC_SEED(well_engine, UIntType, value)
    {
        // New seeding algorithm from 
        // http://www.math.sci.hiroshima-u.ac.jp/~m-mat/MT/MT2002/emt19937ar.html
        // In the previous versions, MSBs of the seed affected only MSBs of the
        // state x[].
        const UIntType mask = (max)();

        state_[0] = value & mask;
        
        std::size_t i = 1;
        UIntType (&s)[state_size] = state_;

        for ( ; i != state_size; ++i) {
            // See Knuth "The Art of Computer Programming"
            // Vol. 2, 3rd ed., page 106
            s[i] = static_cast<UIntType>((1812433253U * (s[i - 1] ^ (s[i - 1] >> (w - 2))) + i) & mask);
        }

        index_ = i;
    }